

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O3

int __thiscall ncnn::Dequantize::load_model(Dequantize *this,ModelBin *mb)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  void *local_58;
  int *local_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->bias_data_size,1);
    if (&this->bias_data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->bias_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          __ptr = (this->bias_data).data;
          pAVar2 = (this->bias_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_data).data = local_58;
      (this->bias_data).refcount = local_50;
      (this->bias_data).elemsize = local_48;
      (this->bias_data).elempack = local_40;
      (this->bias_data).allocator = local_38;
      (this->bias_data).dims = local_30;
      (this->bias_data).w = iStack_2c;
      (this->bias_data).h = iStack_28;
      (this->bias_data).c = iStack_24;
      (this->bias_data).cstep = local_20;
    }
    if (local_50 != (int *)0x0) {
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 == 0) {
        if (local_38 == (Allocator *)0x0) {
          if (local_58 != (void *)0x0) {
            free(local_58);
          }
        }
        else {
          (*local_38->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Dequantize::load_model(const ModelBin& mb)
{
    if (bias_term)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}